

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes>::TestBody
          (MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes> *this)

{
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  char encoded [8];
  TestMessageSet message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  undefined8 local_48;
  TestMessageSet local_40;
  
  local_48 = 0xc04100008021a0b;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(&local_40,(Arena *)0x0);
  local_78[0] = (internal)MessageLite::ParseFromArray((MessageLite *)&local_40,&local_48,8);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,
               (AssertionResult *)"message.ParseFromArray(encoded, sizeof(encoded))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x29f,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&local_40);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, MessageSetUnknownButValidTypeId) {
  const char encoded[] = {
      013,     // 1: SGROUP
      032, 2,  // 3:LEN 2
      010, 0,  // 1:0
      020, 4,  // 2:4
      014      // 1: EGROUP
  };
  typename TestFixture::TestMessageSet message;
  EXPECT_TRUE(message.ParseFromArray(encoded, sizeof(encoded)));
}